

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O1

void get_yolo_detections(yolo_layer *layer,vector<detection,_std::allocator<detection>_> *detections
                        ,int im_w,int im_h,int netw,int neth,float thresh)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  float fVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vector<detection,_std::allocator<detection>_> result;
  value_type local_148;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  vector<detection,_std::allocator<detection>_> *local_f8;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  double local_d8;
  double dStack_d0;
  undefined1 local_c8 [16];
  pointer local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_f0._0_4_ = layer->w;
  local_f0._4_4_ = layer->h;
  pfVar2 = (layer->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = (pointer)0x0;
  iVar8 = local_f0._4_4_ * (int)local_f0;
  local_f8 = detections;
  if (0 < iVar8) {
    local_118 = (ulong)((long)(layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
    local_78 = CONCAT44((float)(int)local_f0._4_4_,(float)(int)local_f0);
    uStack_70 = 0;
    local_100 = (ulong)(uint)(iVar8 * 2);
    local_108 = (ulong)(uint)(iVar8 * 3);
    auVar26._4_4_ = neth;
    auVar26._0_4_ = netw;
    auVar26._8_8_ = 0;
    local_d8 = (double)netw;
    dStack_d0 = (double)neth;
    local_88._0_4_ = (float)netw;
    local_88._4_4_ = (float)neth;
    local_88._8_8_ = 0;
    auVar22._0_4_ = (float)im_w;
    auVar22._4_4_ = (float)im_h;
    auVar22._8_8_ = 0;
    local_98 = divps(local_88,auVar22);
    local_a8 = local_98._4_4_;
    uVar15 = (ulong)((uint)local_118 & 0x7fffffff);
    iVar7 = 0;
    local_110 = uVar15;
    local_e8 = auVar26;
    fStack_a4 = local_a8;
    fStack_a0 = local_a8;
    fStack_9c = local_a8;
    do {
      if (0 < (int)local_118) {
        uVar11 = 0;
        do {
          fVar16 = auVar26._4_4_;
          iVar12 = iVar8 * (int)uVar11 + iVar7;
          iVar14 = layer->h * layer->w;
          iVar13 = (layer->classes + 5) * (iVar12 / iVar14);
          fVar1 = pfVar2[(iVar13 + 4) * iVar14 + iVar12 % iVar14];
          if (thresh < fVar1) {
            local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            iVar6 = iVar7 / (int)local_f0;
            iVar9 = iVar7 % (int)local_f0;
            iVar14 = iVar13 * iVar14 + iVar12 % iVar14;
            pfVar3 = (layer->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar13 = (layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11];
            local_48 = CONCAT44(pfVar3[iVar8 + iVar14],pfVar3[iVar14]);
            uStack_40 = 0;
            local_58 = exp((double)pfVar3[(int)local_100 + iVar14]);
            local_68 = ZEXT416((uint)(layer->anchors).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[(long)iVar13 * 2]);
            dVar17 = exp((double)pfVar3[(int)local_108 + iVar14]);
            auVar21._0_4_ = (float)iVar9 + (float)local_48;
            auVar21._4_4_ = (float)iVar6 + local_48._4_4_;
            auVar21._8_4_ = (float)uStack_40 + 0.0;
            auVar21._12_4_ = fVar16 + uStack_40._4_4_;
            auVar5._8_8_ = uStack_70;
            auVar5._0_8_ = local_78;
            auVar22 = divps(auVar21,auVar5);
            auVar25._0_8_ = local_58 * (double)(float)local_68._0_4_;
            auVar25._8_8_ =
                 dVar17 * (double)(layer->anchors).super__Vector_base<float,_std::allocator<float>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar13 * 2 + 1];
            auVar19._8_8_ = dStack_d0;
            auVar19._0_8_ = local_d8;
            auVar26 = divpd(auVar25,auVar19);
            if (local_a8 <= (float)local_98._0_4_) {
              iVar13 = (neth * im_w) / im_h;
              iVar14 = local_e8._4_4_;
            }
            else {
              iVar13 = local_e8._0_4_;
              iVar14 = (netw * im_h) / im_w;
            }
            auVar23._0_4_ = (float)iVar13;
            auVar23._4_4_ = (float)iVar14;
            auVar23._8_4_ = (float)(int)local_e8._8_4_;
            auVar23._12_4_ = (float)(int)local_e8._12_4_;
            auVar18._0_8_ = (double)(local_e8._0_4_ - iVar13) * -0.5;
            auVar18._8_8_ = (double)(local_e8._4_4_ - iVar14) * -0.5;
            auVar4._8_8_ = dStack_d0;
            auVar4._0_8_ = local_d8;
            auVar19 = divpd(auVar18,auVar4);
            auVar20._0_8_ = auVar19._0_8_ + (double)auVar22._0_4_;
            auVar20._8_8_ = auVar19._8_8_ + (double)auVar22._4_4_;
            auVar19 = divps(local_88,auVar23);
            auVar22 = divps(auVar23,local_88);
            auVar24._0_8_ = (double)auVar22._0_4_;
            auVar24._8_8_ = (double)auVar22._4_4_;
            auVar22 = divpd(auVar20,auVar24);
            local_148.bbox.x = (float)auVar22._0_8_;
            local_148.bbox.y = (float)auVar22._8_8_;
            local_148.bbox.h = (float)auVar26._8_8_ * auVar19._4_4_;
            local_148.bbox.w = (float)auVar26._0_8_ * auVar19._0_4_;
            local_148.objectness = fVar1;
            std::vector<float,_std::allocator<float>_>::resize(&local_148.prob,(long)layer->classes)
            ;
            uVar15 = local_110;
            iVar13 = layer->classes;
            auVar26 = ZEXT416((uint)thresh);
            if (0 < (long)iVar13) {
              iVar14 = layer->h * layer->w;
              iVar12 = ((iVar13 + 5) * (iVar12 / iVar14) + 5) * iVar14 + iVar12 % iVar14;
              lVar10 = 0;
              do {
                fVar16 = pfVar2[iVar12] * fVar1;
                local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10] =
                     (float)(-(uint)(thresh < fVar16) & (uint)fVar16);
                lVar10 = lVar10 + 1;
                iVar12 = iVar12 + iVar14;
              } while (iVar13 != lVar10);
            }
            std::vector<detection,_std::allocator<detection>_>::push_back(local_f8,&local_148);
            if (local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148.prob.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_148.prob.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_148.prob.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar15);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar8);
  }
  std::vector<detection,_std::allocator<detection>_>::~vector
            ((vector<detection,_std::allocator<detection>_> *)local_c8);
  return;
}

Assistant:

static void get_yolo_detections(const yolo_layer & layer, std::vector<detection> & detections, int im_w, int im_h, int netw, int neth, float thresh)
{
    int w = layer.w;
    int h = layer.h;
    int N = layer.mask.size();
    const float * predictions = layer.predictions.data();
    std::vector<detection> result;
    for (int i = 0; i < w*h; i++) {
        for (int n = 0; n < N; n++) {
            int obj_index = layer.entry_index(n*w*h + i, 4);
            float objectness = predictions[obj_index];
            if (objectness <= thresh) {
                continue;
            }
            detection det;
            int box_index = layer.entry_index(n*w*h + i, 0);
            int row = i / w;
            int col = i % w;
            det.bbox = get_yolo_box(layer, layer.mask[n], box_index, col, row, w, h, netw, neth, w*h);
            correct_yolo_box(det.bbox, im_w, im_h, netw, neth);
            det.objectness = objectness;
            det.prob.resize(layer.classes);
            for (int j = 0; j < layer.classes; j++) {
                int class_index = layer.entry_index(n*w*h + i, 4 + 1 + j);
                float prob = objectness*predictions[class_index];
                det.prob[j] = (prob > thresh) ? prob : 0;
            }
            detections.push_back(det);
        }
    }
}